

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O1

void __thiscall
QWhatsThat::QWhatsThat(QWhatsThat *this,QString *txt,QWidget *parent,QWidget *showTextFor)

{
  QCursor *this_00;
  Data *pDVar1;
  QFont *pQVar2;
  long *plVar3;
  char cVar4;
  int iVar5;
  Data *pDVar6;
  QPalette *palette;
  QTextDocument *this_01;
  undefined4 uVar7;
  uint uVar8;
  qsizetype qVar9;
  int extraout_EDX;
  uint unaff_EBP;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  QAnyStringView QVar15;
  undefined1 auVar16 [16];
  undefined1 local_60 [8];
  undefined1 local_58 [8];
  uint local_50;
  undefined4 local_4c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::QWidget(&this->super_QWidget,parent,(WindowFlags)0x9);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007fac50;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QWhatsThat_007fae00;
  if (showTextFor == (QWidget *)0x0) {
    pDVar6 = (Data *)0x0;
  }
  else {
    pDVar6 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&showTextFor->super_QObject);
  }
  (this->widget).wp.d = pDVar6;
  (this->widget).wp.value = &showTextFor->super_QObject;
  this->pressed = false;
  pDVar1 = (txt->d).d;
  (this->text).d.d = pDVar1;
  (this->text).d.ptr = (txt->d).ptr;
  qVar9 = (txt->d).size;
  (this->text).d.size = qVar9;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this->anchor).d.d = (Data *)0x0;
  (this->anchor).d.ptr = (char16_t *)0x0;
  (this->anchor).d.size = 0;
  if (instance != (QWhatsThat *)0x0) {
    (**(code **)(*(long *)&instance->super_QWidget + 0x20))();
  }
  uVar7 = (undefined4)qVar9;
  instance = this;
  QWidget::setAttribute(&this->super_QWidget,WA_DeleteOnClose,true);
  QWidget::setAttribute(&this->super_QWidget,WA_NoSystemBackground,true);
  if (parent != (QWidget *)0x0) {
    palette = QWidget::palette(parent);
    QWidget::setPalette(&this->super_QWidget,palette);
  }
  QWidget::setAttribute(&this->super_QWidget,WA_MouseTracking,true);
  QWidget::setFocusPolicy(&this->super_QWidget,StrongFocus);
  this_00 = (QCursor *)(local_60 + 8);
  QCursor::QCursor(this_00,ArrowCursor);
  QWidget::setCursor(&this->super_QWidget,this_00);
  QCursor::~QCursor(this_00);
  this->doc = (QTextDocument *)0x0;
  QWidget::ensurePolished(&this->super_QWidget);
  QVar15.m_size = (this->text).d.size | 0x8000000000000000;
  QVar15.field_0.m_data_utf16 = (this->text).d.ptr;
  cVar4 = Qt::mightBeRichText(QVar15);
  if (cVar4 == '\0') {
    QGuiApplication::primaryScreen();
    iVar5 = QScreen::virtualGeometry();
    uVar8 = (extraout_EDX - iVar5) + 1;
    unaff_EBP = 199;
    if (599 < (int)uVar8) {
      uVar8 = uVar8 / 3;
      uVar10 = 300;
      if (uVar8 < 300) {
        uVar10 = uVar8;
      }
      unaff_EBP = uVar10 - 1;
    }
    QFontMetrics::QFontMetrics((QFontMetrics *)local_60,&((this->super_QWidget).data)->fnt);
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    local_4c = 999;
    local_50 = unaff_EBP;
    auVar16 = QFontMetrics::boundingRect
                        ((QRect *)local_60,(int)local_60 + 8,(QString *)0x1421,(int)this + 0x40,
                         (int *)0x0);
    QFontMetrics::~QFontMetrics((QFontMetrics *)local_60);
  }
  else {
    this_01 = (QTextDocument *)operator_new(0x10);
    QTextDocument::QTextDocument(this_01,(QObject *)0x0);
    this->doc = this_01;
    QTextDocument::setUndoRedoEnabled(SUB81(this_01,0));
    pQVar2 = (QFont *)this->doc;
    QApplication::font((QApplication *)(local_60 + 8),&this->super_QWidget);
    QTextDocument::setDefaultFont(pQVar2);
    QFont::~QFont((QFont *)(local_60 + 8));
    QTextDocument::setHtml((QString *)this->doc);
    QTextDocument::setUndoRedoEnabled(SUB81(this->doc,0));
    QTextDocument::adjustSize();
    auVar16 = QTextDocument::size();
    auVar13._0_8_ =
         (double)((ulong)auVar16._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar16._8_8_;
    auVar13._8_8_ =
         (double)((ulong)auVar16._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar16._0_8_;
    auVar16 = minpd(_DAT_0066f5d0,auVar13);
    auVar14._8_8_ = -(ulong)(-2147483648.0 < auVar16._8_8_);
    auVar14._0_8_ = -(ulong)(-2147483648.0 < auVar16._0_8_);
    uVar8 = movmskpd(uVar7,auVar14);
    uVar11 = 0x7fffffff;
    if ((uVar8 & 2) != 0) {
      uVar11 = (ulong)((int)auVar16._8_8_ - 1);
    }
    uVar12 = 0x7fffffff00000000;
    if ((uVar8 & 1) != 0) {
      uVar12 = (ulong)((int)auVar16._0_8_ - 1) << 0x20;
    }
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar12 | uVar11;
    auVar16 = auVar16 << 0x40;
  }
  plVar3 = QGuiApplicationPrivate::platform_theme;
  if (QGuiApplicationPrivate::platform_theme != (long *)0x0) {
    (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x60))
              ((QVariant *)(local_60 + 8),QGuiApplicationPrivate::platform_theme,9);
    unaff_EBP = ::QVariant::toBool();
    ::QVariant::~QVariant((QVariant *)(local_60 + 8));
  }
  shadowWidth = 0;
  if ((unaff_EBP & 1) == 0) {
    shadowWidth = 6;
  }
  if (plVar3 == (long *)0x0) {
    shadowWidth = 6;
  }
  local_58._4_4_ = shadowWidth + (auVar16._12_4_ - auVar16._4_4_) + 0x11;
  local_58._0_4_ = (auVar16._8_4_ - auVar16._0_4_) + shadowWidth + 0x19;
  QWidget::resize(&this->super_QWidget,(QSize *)(local_60 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWhatsThat::QWhatsThat(const QString& txt, QWidget* parent, QWidget *showTextFor)
    : QWidget(parent, Qt::Popup),
      widget(showTextFor), pressed(false), text(txt)
{
    delete instance;
    instance = this;
    setAttribute(Qt::WA_DeleteOnClose, true);
    setAttribute(Qt::WA_NoSystemBackground, true);
    if (parent)
        setPalette(parent->palette());
    setMouseTracking(true);
    setFocusPolicy(Qt::StrongFocus);
#ifndef QT_NO_CURSOR
    setCursor(Qt::ArrowCursor);
#endif
    QRect r;
    doc = nullptr;
    ensurePolished(); // Ensures style sheet font before size calc
    if (Qt::mightBeRichText(text)) {
        doc = new QTextDocument();
        doc->setUndoRedoEnabled(false);
        doc->setDefaultFont(QApplication::font(this));
#ifdef QT_NO_TEXTHTMLPARSER
        doc->setPlainText(text);
#else
        doc->setHtml(text);
#endif
        doc->setUndoRedoEnabled(false);
        doc->adjustSize();
        r.setTop(0);
        r.setLeft(0);
        r.setSize(doc->size().toSize());
    }
    else
    {
        int sw = QGuiApplication::primaryScreen()->virtualGeometry().width() / 3;
        if (sw < 200)
            sw = 200;
        else if (sw > 300)
            sw = 300;

        r = fontMetrics().boundingRect(0, 0, sw, 1000,
                                        Qt::AlignLeft | Qt::AlignTop
                                        | Qt::TextWordWrap | Qt::TextExpandTabs,
                                        text);
    }
    shadowWidth = dropShadow() ? 0 : 6;
    resize(r.width() + 2*hMargin + shadowWidth, r.height() + 2*vMargin + shadowWidth);
}